

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O1

int (anonymous_namespace)::store_bool<int,char>(int *out,char *val)

{
  int iVar1;
  undefined4 uVar2;
  
  iVar1 = 3;
  if (out != (int *)0x0) {
    iVar1 = strcmp("false",(char *)out);
    uVar2 = 0;
    if ((iVar1 != 0) && (iVar1 = strcmp("0",(char *)out), iVar1 != 0)) {
      iVar1 = strcmp("true",(char *)out);
      uVar2 = 1;
      if ((iVar1 != 0) && (iVar1 = strcmp("1",(char *)out), iVar1 != 0)) {
        return 3;
      }
    }
    iVar1 = 0;
    global_state_singleton._56_4_ = uVar2;
  }
  return iVar1;
}

Assistant:

int store_bool(INT_T *out, const CHAR_T *val)
{
    static const char* const s_zero  = "0";
    static const char* const s_one   = "1";
    static const char* const s_true  = "true";
    static const char* const s_false = "false";
    
    if (val == 0)
        return __CILKRTS_SET_PARAM_INVALID;

    if (strmatch(s_false, val) || strmatch(s_zero, val)) { 
        *out = 0;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    if (strmatch(s_true, val) || strmatch(s_one, val)) { 
        *out = 1;
        return __CILKRTS_SET_PARAM_SUCCESS;
    }

    return __CILKRTS_SET_PARAM_INVALID;
}